

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

PyObject * pybind11_meta_call(PyObject *type,PyObject *args,PyObject *kwargs)

{
  byte bVar1;
  pointer pptVar2;
  pointer pptVar3;
  undefined8 uVar4;
  PyObject *pPVar5;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar6;
  long lVar7;
  type_info *ptVar8;
  ulong uVar9;
  byte bVar10;
  bool bVar11;
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  pPVar5 = (PyObject *)(*_PyFloat_AsDouble)();
  if (pPVar5 == (PyObject *)0x0) {
LAB_0010c38b:
    pPVar5 = (PyObject *)0x0;
  }
  else {
    pvVar6 = pybind11::detail::all_type_info(pPVar5->ob_type);
    uVar4 = _PyExc_TypeError;
    pptVar2 = (pvVar6->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pptVar3 = (pvVar6->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pptVar2 == pptVar3) {
      ptVar8 = (type_info *)0x0;
    }
    else {
      ptVar8 = *pptVar2;
    }
    lVar7 = (long)pptVar3 - (long)pptVar2;
    if (lVar7 != 0) {
      bVar1 = (byte)pPVar5[3].ob_refcnt;
      pptVar2 = (pvVar6->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = 1;
      do {
        bVar10 = bVar1 >> 2;
        if ((bVar1 & 2) == 0) {
          bVar10 = *(byte *)((long)pPVar5[1].ob_type + (uVar9 - 1));
        }
        if ((bVar10 & 1) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_38,ptVar8->type->tp_name,&local_39);
          PyErr_Format(uVar4,"%.200s.__init__() must be called when overriding __init__",local_38[0]
                      );
          if (local_38[0] != local_28) {
            operator_delete(local_38[0],local_28[0] + 1);
          }
          pPVar5->ob_refcnt = pPVar5->ob_refcnt + -1;
          if (pPVar5->ob_refcnt == 0) {
            _Py_Dealloc(pPVar5);
          }
          goto LAB_0010c38b;
        }
        if (uVar9 < (ulong)((long)(pvVar6->
                                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pptVar2 >> 3))
        {
          ptVar8 = pptVar2[uVar9];
        }
        else {
          ptVar8 = (type_info *)0x0;
        }
        bVar11 = uVar9 != lVar7 >> 3;
        uVar9 = uVar9 + 1;
      } while (bVar11);
    }
  }
  return pPVar5;
}

Assistant:

inline PyObject *pybind11_meta_call(PyObject *type, PyObject *args, PyObject *kwargs) {

    // use the default metaclass call to create/initialize the object
    PyObject *self = PyType_Type.tp_call(type, args, kwargs);
    if (self == nullptr) {
        return nullptr;
    }

    // This must be a pybind11 instance
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Ensure that the base __init__ function(s) were called
    for (const auto &vh : values_and_holders(instance)) {
        if (!vh.holder_constructed()) {
            PyErr_Format(PyExc_TypeError, "%.200s.__init__() must be called when overriding __init__",
                         get_fully_qualified_tp_name(vh.type->type).c_str());
            Py_DECREF(self);
            return nullptr;
        }
    }

    return self;
}